

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O3

Kit_Edge_t Kit_GraphAddNodeOr(Kit_Graph_t *pGraph,Kit_Edge_t eEdge0,Kit_Edge_t eEdge1)

{
  Kit_Node_t *pKVar1;
  
  pKVar1 = Kit_GraphAppendNode(pGraph);
  *(uint *)&pKVar1->field_0x10 =
       (*(uint *)&pKVar1->field_0x10 & 0xfffe3fff) +
       (((uint)eEdge1 & 1) << 0x10 | ((uint)eEdge0 & 1) << 0xf) + 0x4000;
  pKVar1->eEdge0 = (Kit_Edge_t)((uint)eEdge0 ^ 1);
  pKVar1->eEdge1 = (Kit_Edge_t)((uint)eEdge1 ^ 1);
  return (Kit_Edge_t)((pGraph->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
}

Assistant:

Kit_Edge_t Kit_GraphAddNodeOr( Kit_Graph_t * pGraph, Kit_Edge_t eEdge0, Kit_Edge_t eEdge1 )
{
    Kit_Node_t * pNode;
    // get the new node
    pNode = Kit_GraphAppendNode( pGraph );
    // set the inputs and other info
    pNode->eEdge0 = eEdge0;
    pNode->eEdge1 = eEdge1;
    pNode->fCompl0 = eEdge0.fCompl;
    pNode->fCompl1 = eEdge1.fCompl;
    // make adjustments for the OR gate
    pNode->fNodeOr = 1;
    pNode->eEdge0.fCompl = !pNode->eEdge0.fCompl;
    pNode->eEdge1.fCompl = !pNode->eEdge1.fCompl;
    return Kit_EdgeCreate( pGraph->nSize - 1, 1 );
}